

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_manyvec.c
# Opt level: O2

int fe(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  int iVar7;
  undefined8 uVar8;
  void *flagvalue;
  void *flagvalue_00;
  void *flagvalue_01;
  undefined8 *flagvalue_02;
  undefined8 *flagvalue_03;
  undefined8 *flagvalue_04;
  int iVar9;
  long lVar10;
  
  lVar6 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x20);
  dVar2 = *(double *)((long)user_data + 0x28);
  dVar3 = *(double *)((long)user_data + 0x30);
  dVar4 = *(double *)((long)user_data + 8);
  uVar8 = N_VGetSubvector_ManyVector(y,0);
  flagvalue = (void *)N_VGetArrayPointer(uVar8);
  iVar7 = check_flag(flagvalue,"N_VGetArrayPointer",0);
  iVar9 = 1;
  if (iVar7 == 0) {
    uVar8 = N_VGetSubvector_ManyVector(y,1);
    flagvalue_00 = (void *)N_VGetArrayPointer(uVar8);
    iVar7 = check_flag(flagvalue_00,"N_VGetArrayPointer",0);
    if (iVar7 == 0) {
      uVar8 = N_VGetSubvector_ManyVector(y,2);
      flagvalue_01 = (void *)N_VGetArrayPointer(uVar8);
      iVar7 = check_flag(flagvalue_01,"N_VGetArrayPointer",0);
      if (iVar7 == 0) {
        uVar8 = N_VGetSubvector_ManyVector(ydot,0);
        flagvalue_02 = (undefined8 *)N_VGetArrayPointer(uVar8);
        iVar7 = check_flag(flagvalue_02,"N_VGetArrayPointer",0);
        if (iVar7 == 0) {
          lVar10 = 1;
          uVar8 = N_VGetSubvector_ManyVector(ydot,1);
          flagvalue_03 = (undefined8 *)N_VGetArrayPointer(uVar8);
          iVar7 = check_flag(flagvalue_03,"N_VGetArrayPointer",0);
          if (iVar7 == 0) {
            uVar8 = N_VGetSubvector_ManyVector(ydot,2);
            flagvalue_04 = (undefined8 *)N_VGetArrayPointer(uVar8);
            iVar7 = check_flag(flagvalue_04,"N_VGetArrayPointer",0);
            if (iVar7 == 0) {
              N_VConst(0,ydot);
              for (; lVar10 < lVar6 + -1; lVar10 = lVar10 + 1) {
                dVar5 = *(double *)((long)flagvalue + lVar10 * 8);
                flagvalue_02[lVar10] =
                     ((*(double *)((long)flagvalue + lVar10 * 8 + -8) - (dVar5 + dVar5)) +
                     *(double *)((long)flagvalue + lVar10 * 8 + 8)) * ((dVar1 / dVar4) / dVar4);
                dVar5 = *(double *)((long)flagvalue_00 + lVar10 * 8);
                flagvalue_03[lVar10] =
                     ((*(double *)((long)flagvalue_00 + lVar10 * 8 + -8) - (dVar5 + dVar5)) +
                     *(double *)((long)flagvalue_00 + lVar10 * 8 + 8)) * ((dVar2 / dVar4) / dVar4);
                dVar5 = *(double *)((long)flagvalue_01 + lVar10 * 8);
                flagvalue_04[lVar10] =
                     ((*(double *)((long)flagvalue_01 + lVar10 * 8 + -8) - (dVar5 + dVar5)) +
                     *(double *)((long)flagvalue_01 + lVar10 * 8 + 8)) * ((dVar3 / dVar4) / dVar4);
              }
              *flagvalue_04 = 0;
              *flagvalue_03 = 0;
              *flagvalue_02 = 0;
              flagvalue_04[lVar6 + -1] = 0;
              flagvalue_03[lVar6 + -1] = 0;
              flagvalue_02[lVar6 + -1] = 0;
              iVar9 = 0;
            }
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

static int fe(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData userdata = (UserData)user_data; /* access problem data */
  sunindextype N    = userdata->N;         /* set variable shortcuts */
  sunrealtype du    = userdata->du;
  sunrealtype dv    = userdata->dv;
  sunrealtype dw    = userdata->dw;
  sunrealtype dx    = userdata->dx;
  sunrealtype *y_u = NULL, *y_v = NULL, *y_w = NULL;
  sunrealtype *f_u = NULL, *f_v = NULL, *f_w = NULL;
  sunrealtype uconst, vconst, wconst;
  sunindextype i;

  y_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 0));
  if (check_flag((void*)y_u, "N_VGetArrayPointer", 0)) { return 1; }
  y_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 1));
  if (check_flag((void*)y_v, "N_VGetArrayPointer", 0)) { return 1; }
  y_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 2));
  if (check_flag((void*)y_w, "N_VGetArrayPointer", 0)) { return 1; }

  f_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 0));
  if (check_flag((void*)f_u, "N_VGetArrayPointer", 0)) { return 1; }
  f_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 1));
  if (check_flag((void*)f_v, "N_VGetArrayPointer", 0)) { return 1; }
  f_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 2));
  if (check_flag((void*)f_w, "N_VGetArrayPointer", 0)) { return 1; }

  N_VConst(SUN_RCONST(0.0), ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  uconst = du / dx / dx;
  vconst = dv / dx / dx;
  wconst = dw / dx / dx;
  for (i = 1; i < N - 1; i++)
  {
    /* Fill in ODE RHS for u */
    f_u[i] = (y_u[i - 1] - TWO * y_u[i] + y_u[i + 1]) * uconst;

    /* Fill in ODE RHS for v */
    f_v[i] = (y_v[i - 1] - TWO * y_v[i] + y_v[i + 1]) * vconst;

    /* Fill in ODE RHS for w */
    f_w[i] = (y_w[i - 1] - TWO * y_w[i] + y_w[i + 1]) * wconst;
  }

  /* enforce stationary boundaries */
  f_u[0] = f_v[0] = f_w[0] = ZERO;
  f_u[N - 1] = f_v[N - 1] = f_w[N - 1] = ZERO;

  return 0; /* Return with success */
}